

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbePmaReaderSeek(SortSubtask *pTask,PmaReader *pReadr,SorterFile *pFile,i64 iOff)

{
  sqlite3_file *psVar1;
  long lVar2;
  int iVar3;
  u8 *puVar4;
  long lVar5;
  int iVar6;
  
  if ((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
     (iVar3 = (*sqlite3Config.xTestCallback)(0xc9), iVar3 != 0)) {
    return 0x10a;
  }
  if (pReadr->aMap != (u8 *)0x0) {
    (*pReadr->pFd->pMethods->xUnfetch)(pReadr->pFd,0,pReadr->aMap);
    pReadr->aMap = (u8 *)0x0;
  }
  pReadr->iReadOff = iOff;
  lVar5 = pFile->iEof;
  pReadr->iEof = lVar5;
  psVar1 = pFile->pFd;
  pReadr->pFd = psVar1;
  iVar3 = 0;
  if ((lVar5 <= pTask->pSorter->db->nMaxSorterMmap) && (iVar3 = 0, 2 < psVar1->pMethods->iVersion))
  {
    iVar3 = (*psVar1->pMethods->xFetch)(psVar1,0,(int)lVar5,&pReadr->aMap);
  }
  if ((iVar3 == 0) && (iVar3 = 0, pReadr->aMap == (u8 *)0x0)) {
    iVar6 = pTask->pSorter->pgsz;
    lVar5 = pReadr->iReadOff % (long)iVar6;
    iVar3 = 0;
    if (pReadr->aBuffer == (u8 *)0x0) {
      puVar4 = (u8 *)sqlite3Malloc((long)iVar6);
      pReadr->aBuffer = puVar4;
      iVar3 = 7;
      if (puVar4 != (u8 *)0x0) {
        iVar3 = 0;
      }
      pReadr->nBuffer = iVar6;
    }
    if (lVar5 != 0 && iVar3 == 0) {
      iVar6 = iVar6 - (int)lVar5;
      lVar2 = pReadr->iReadOff;
      if (pReadr->iEof < lVar2 + iVar6) {
        iVar6 = (int)pReadr->iEof - (int)lVar2;
      }
      iVar3 = (*pReadr->pFd->pMethods->xRead)(pReadr->pFd,pReadr->aBuffer + lVar5,iVar6,lVar2);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int vdbePmaReaderSeek(
  SortSubtask *pTask,             /* Task context */
  PmaReader *pReadr,              /* Reader whose cursor is to be moved */
  SorterFile *pFile,              /* Sorter file to read from */
  i64 iOff                        /* Offset in pFile */
){
  int rc = SQLITE_OK;

  assert( pReadr->pIncr==0 || pReadr->pIncr->bEof==0 );

  if( sqlite3FaultSim(201) ) return SQLITE_IOERR_READ;
  if( pReadr->aMap ){
    sqlite3OsUnfetch(pReadr->pFd, 0, pReadr->aMap);
    pReadr->aMap = 0;
  }
  pReadr->iReadOff = iOff;
  pReadr->iEof = pFile->iEof;
  pReadr->pFd = pFile->pFd;

  rc = vdbeSorterMapFile(pTask, pFile, &pReadr->aMap);
  if( rc==SQLITE_OK && pReadr->aMap==0 ){
    int pgsz = pTask->pSorter->pgsz;
    int iBuf = pReadr->iReadOff % pgsz;
    if( pReadr->aBuffer==0 ){
      pReadr->aBuffer = (u8*)sqlite3Malloc(pgsz);
      if( pReadr->aBuffer==0 ) rc = SQLITE_NOMEM_BKPT;
      pReadr->nBuffer = pgsz;
    }
    if( rc==SQLITE_OK && iBuf ){
      int nRead = pgsz - iBuf;
      if( (pReadr->iReadOff + nRead) > pReadr->iEof ){
        nRead = (int)(pReadr->iEof - pReadr->iReadOff);
      }
      rc = sqlite3OsRead(
          pReadr->pFd, &pReadr->aBuffer[iBuf], nRead, pReadr->iReadOff
      );
      testcase( rc!=SQLITE_OK );
    }
  }

  return rc;
}